

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.h
# Opt level: O0

double __thiscall quad::pdf_value(quad *this,point3 *origin,vec3 *direction)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double cosine;
  double distance_squared;
  interval local_e0 [2];
  ray local_c0;
  undefined1 local_88 [8];
  hit_record rec;
  vec3 *direction_local;
  point3 *origin_local;
  quad *this_local;
  
  rec._88_8_ = direction;
  hit_record::hit_record((hit_record *)local_88);
  ray::ray(&local_c0,origin,(vec3 *)rec._88_8_);
  interval::interval(local_e0,0.001,INFINITY);
  iVar1 = (*(this->super_hittable)._vptr_hittable[2])
                    (local_e0[0].min,local_e0[0].max._0_4_,this,&local_c0,local_88);
  if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
    dVar2 = vec3::length_squared((vec3 *)rec._88_8_);
    dVar3 = dot((vec3 *)rec._88_8_,(vec3 *)(rec.p.e + 2));
    dVar4 = vec3::length((vec3 *)rec._88_8_);
    this_local = (quad *)(((double)rec.mat.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi *
                           (double)rec.mat.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi * dVar2) / (ABS(dVar3 / dVar4) * this->area));
  }
  else {
    this_local = (quad *)0x0;
  }
  hit_record::~hit_record((hit_record *)local_88);
  return (double)this_local;
}

Assistant:

double pdf_value(const point3& origin, const vec3& direction) const override {
        hit_record rec;
        if (!this->hit(ray(origin, direction), interval(0.001, infinity), rec))
            return 0;

        auto distance_squared = rec.t * rec.t * direction.length_squared();
        auto cosine = std::fabs(dot(direction, rec.normal) / direction.length());

        return distance_squared / (cosine * area);
    }